

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

bool __thiscall TestRange<bool>::getEntry(TestRange<bool> *this,size_t idx)

{
  bool bVar1;
  RangeType RVar2;
  size_t sVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  RVar2 = this->type;
  if (RVar2 == EXPONENTIAL) {
    bVar1 = this->begin;
    auVar5._8_4_ = (int)(idx >> 0x20);
    auVar5._0_8_ = idx;
    auVar5._12_4_ = 0x45300000;
    dVar4 = pow((double)(int)this->step,
                (auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)idx) - 4503599627370496.0));
    return (long)(dVar4 * (double)(int)bVar1) != 0;
  }
  if (RVar2 != LINEAR) {
    if (RVar2 == ARRAY) {
      sVar3 = idx + 0x3f;
      if (-1 < (long)idx) {
        sVar3 = idx;
      }
      return ((this->array).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [((long)sVar3 >> 6) +
               (ulong)((idx & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
              (idx & 0x3f) & 1) != 0;
    }
    return this->begin;
  }
  return this->step * idx + (ulong)this->begin != 0;
}

Assistant:

T getEntry(size_t idx) {
        if (type == RangeType::ARRAY) {
            return (T)(array[idx]);
        } else if (type == RangeType::LINEAR) {
            return (T)(begin + step * idx);
        } else if (type == RangeType::EXPONENTIAL) {
            ssize_t _begin = begin;
            ssize_t _step = step;
            ssize_t _ret = (ssize_t)( _begin * std::pow(_step, idx) );
            return (T)(_ret);
        }

        return begin;
    }